

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void InitWindow(int width,int height,char *title)

{
  undefined8 uVar1;
  Texture2D texture;
  ulong uVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  Rectangle source;
  float local_c8;
  float fStack_c4;
  undefined8 local_a4;
  undefined8 uStack_9c;
  int local_94;
  undefined8 local_74;
  undefined8 uStack_6c;
  int local_64;
  long local_30;
  
  TraceLog(3,"Initializing raylib %s","5.5");
  TraceLog(3,"Platform backend: DESKTOP (GLFW)");
  TraceLog(3,"Supported raylib modules:");
  TraceLog(3,"    > rcore:..... loaded (mandatory)");
  TraceLog(3,"    > rlgl:...... loaded (mandatory)");
  TraceLog(3,"    > rshapes:... loaded (optional)");
  TraceLog(3,"    > rtextures:. loaded (optional)");
  TraceLog(3,"    > rtext:..... loaded (optional)");
  TraceLog(3,"    > rmodels:... loaded (optional)");
  TraceLog(3,"    > raudio:.... loaded (optional)");
  CORE.Window.eventWaiting = false;
  CORE.Window.screenScale.m0 = 1.0;
  CORE.Window.screenScale.m4 = 0.0;
  CORE.Window.screenScale.m8 = 0.0;
  CORE.Window.screenScale.m12 = 0.0;
  CORE.Window.screenScale.m1 = 0.0;
  CORE.Window.screenScale.m5 = 1.0;
  CORE.Window.screenScale.m9 = 0.0;
  CORE.Window.screenScale.m13 = 0.0;
  CORE.Window.screenScale.m2 = 0.0;
  CORE.Window.screenScale.m6 = 0.0;
  CORE.Window.screenScale.m10 = 1.0;
  CORE.Window.screenScale.m14 = 0.0;
  CORE.Window.screenScale.m3 = 0.0;
  CORE.Window.screenScale.m7 = 0.0;
  CORE.Window.screenScale.m11 = 0.0;
  CORE.Window.screenScale.m15 = 1.0;
  if ((title != (char *)0x0) && (*title != '\0')) {
    CORE.Window.title = title;
  }
  CORE.Window.screen.width = width;
  CORE.Window.screen.height = height;
  memset(&CORE.Input,0,0x9e0);
  CORE.Input.Keyboard.exitKey = 0x100;
  CORE.Input.Mouse.scale.x = 1.0;
  CORE.Input.Mouse.scale.y = 1.0;
  CORE.Input.Mouse.cursor = 1;
  InitPlatform();
  rlglInit(CORE.Window.currentFbo.width,CORE.Window.currentFbo.height);
  isGpuReady = true;
  SetupViewport(CORE.Window.currentFbo.width,CORE.Window.currentFbo.height);
  LoadFontDefault();
  GetFontDefault();
  fVar4 = (float)*(undefined8 *)(local_30 + 0x5f0);
  fVar5 = (float)((ulong)*(undefined8 *)(local_30 + 0x5f0) >> 0x20);
  if (((byte)CORE.Window.flags & 0x20) == 0) {
    fVar4 = fVar4 + 1.0;
    fVar5 = fVar5 + 1.0;
    uVar1 = *(undefined8 *)(local_30 + 0x5f8);
    GetFontDefault();
    local_c8 = (float)uVar1;
    fStack_c4 = (float)((ulong)uVar1 >> 0x20);
    local_c8 = local_c8 + -2.0;
    fStack_c4 = fStack_c4 + -2.0;
  }
  else {
    GetFontDefault();
    fVar4 = fVar4 + 2.0;
    fVar5 = fVar5 + 2.0;
    local_c8 = 1.0;
    fStack_c4 = 1.0;
    local_a4 = local_74;
    uStack_9c = uStack_6c;
    local_94 = local_64;
  }
  texture.height = (int)uStack_9c;
  texture.mipmaps = (int)((ulong)uStack_9c >> 0x20);
  texture.id = (int)local_a4;
  texture.width = (int)((ulong)local_a4 >> 0x20);
  texture.format = local_94;
  source.y = fVar5;
  source.x = fVar4;
  source.height = fStack_c4;
  source.width = local_c8;
  SetShapesTexture(texture,source);
  CORE.Time.frameCounter = 0;
  CORE.Window.shouldClose = false;
  uVar2 = time((time_t *)0x0);
  rprand_set_seed(uVar2 & 0xffffffff);
  pcVar3 = GetWorkingDirectory();
  TraceLog(3,"SYSTEM: Working Directory: %s",pcVar3);
  return;
}

Assistant:

void InitWindow(int width, int height, const char *title)
{
    TRACELOG(LOG_INFO, "Initializing raylib %s", RAYLIB_VERSION);

#if defined(PLATFORM_DESKTOP_GLFW)
    TRACELOG(LOG_INFO, "Platform backend: DESKTOP (GLFW)");
#elif defined(PLATFORM_DESKTOP_SDL)
    TRACELOG(LOG_INFO, "Platform backend: DESKTOP (SDL)");
#elif defined(PLATFORM_DESKTOP_RGFW)
    TRACELOG(LOG_INFO, "Platform backend: DESKTOP (RGFW)");
#elif defined(PLATFORM_WEB)
    TRACELOG(LOG_INFO, "Platform backend: WEB (HTML5)");
#elif defined(PLATFORM_DRM)
    TRACELOG(LOG_INFO, "Platform backend: NATIVE DRM");
#elif defined(PLATFORM_ANDROID)
    TRACELOG(LOG_INFO, "Platform backend: ANDROID");
#else
    // TODO: Include your custom platform backend!
    // i.e software rendering backend or console backend!
    TRACELOG(LOG_INFO, "Platform backend: CUSTOM");
#endif

    TRACELOG(LOG_INFO, "Supported raylib modules:");
    TRACELOG(LOG_INFO, "    > rcore:..... loaded (mandatory)");
    TRACELOG(LOG_INFO, "    > rlgl:...... loaded (mandatory)");
#if defined(SUPPORT_MODULE_RSHAPES)
    TRACELOG(LOG_INFO, "    > rshapes:... loaded (optional)");
#else
    TRACELOG(LOG_INFO, "    > rshapes:... not loaded (optional)");
#endif
#if defined(SUPPORT_MODULE_RTEXTURES)
    TRACELOG(LOG_INFO, "    > rtextures:. loaded (optional)");
#else
    TRACELOG(LOG_INFO, "    > rtextures:. not loaded (optional)");
#endif
#if defined(SUPPORT_MODULE_RTEXT)
    TRACELOG(LOG_INFO, "    > rtext:..... loaded (optional)");
#else
    TRACELOG(LOG_INFO, "    > rtext:..... not loaded (optional)");
#endif
#if defined(SUPPORT_MODULE_RMODELS)
    TRACELOG(LOG_INFO, "    > rmodels:... loaded (optional)");
#else
    TRACELOG(LOG_INFO, "    > rmodels:... not loaded (optional)");
#endif
#if defined(SUPPORT_MODULE_RAUDIO)
    TRACELOG(LOG_INFO, "    > raudio:.... loaded (optional)");
#else
    TRACELOG(LOG_INFO, "    > raudio:.... not loaded (optional)");
#endif

    // Initialize window data
    CORE.Window.screen.width = width;
    CORE.Window.screen.height = height;
    CORE.Window.eventWaiting = false;
    CORE.Window.screenScale = MatrixIdentity();     // No draw scaling required by default
    if ((title != NULL) && (title[0] != 0)) CORE.Window.title = title;

    // Initialize global input state
    memset(&CORE.Input, 0, sizeof(CORE.Input));     // Reset CORE.Input structure to 0
    CORE.Input.Keyboard.exitKey = KEY_ESCAPE;
    CORE.Input.Mouse.scale = (Vector2){ 1.0f, 1.0f };
    CORE.Input.Mouse.cursor = MOUSE_CURSOR_ARROW;
    CORE.Input.Gamepad.lastButtonPressed = GAMEPAD_BUTTON_UNKNOWN;

    // Initialize platform
    //--------------------------------------------------------------
    InitPlatform();
    //--------------------------------------------------------------

    // Initialize rlgl default data (buffers and shaders)
    // NOTE: CORE.Window.currentFbo.width and CORE.Window.currentFbo.height not used, just stored as globals in rlgl
    rlglInit(CORE.Window.currentFbo.width, CORE.Window.currentFbo.height);
    isGpuReady = true; // Flag to note GPU has been initialized successfully

    // Setup default viewport
    SetupViewport(CORE.Window.currentFbo.width, CORE.Window.currentFbo.height);

#if defined(SUPPORT_MODULE_RTEXT)
    #if defined(SUPPORT_DEFAULT_FONT)
        // Load default font
        // WARNING: External function: Module required: rtext
        LoadFontDefault();
        #if defined(SUPPORT_MODULE_RSHAPES)
        // Set font white rectangle for shapes drawing, so shapes and text can be batched together
        // WARNING: rshapes module is required, if not available, default internal white rectangle is used
        Rectangle rec = GetFontDefault().recs[95];
        if (CORE.Window.flags & FLAG_MSAA_4X_HINT)
        {
            // NOTE: We try to maxime rec padding to avoid pixel bleeding on MSAA filtering
            SetShapesTexture(GetFontDefault().texture, (Rectangle){ rec.x + 2, rec.y + 2, 1, 1 });
        }
        else
        {
            // NOTE: We set up a 1px padding on char rectangle to avoid pixel bleeding
            SetShapesTexture(GetFontDefault().texture, (Rectangle){ rec.x + 1, rec.y + 1, rec.width - 2, rec.height - 2 });
        }
        #endif
    #endif
#else
    #if defined(SUPPORT_MODULE_RSHAPES)
    // Set default texture and rectangle to be used for shapes drawing
    // NOTE: rlgl default texture is a 1x1 pixel UNCOMPRESSED_R8G8B8A8
    Texture2D texture = { rlGetTextureIdDefault(), 1, 1, 1, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8 };
    SetShapesTexture(texture, (Rectangle){ 0.0f, 0.0f, 1.0f, 1.0f });    // WARNING: Module required: rshapes
    #endif
#endif

    CORE.Time.frameCounter = 0;
    CORE.Window.shouldClose = false;

    // Initialize random seed
    SetRandomSeed((unsigned int)time(NULL));

    TRACELOG(LOG_INFO, "SYSTEM: Working Directory: %s", GetWorkingDirectory());
}